

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::PatchGetPropertyScoped<false,Js::InlineCache>
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,FrameDisplay *pDisplay,PropertyId propertyId,Var defaultInstance)

{
  ushort uVar1;
  ScriptContext *scriptContext;
  bool bVar2;
  BOOL BVar3;
  ModuleID moduleID;
  void *aValue;
  RecyclableObject *pRVar4;
  DynamicObject *object;
  UndeclaredBlockVariable *pUVar5;
  int32 hCode;
  uint uVar6;
  uint index;
  bool bVar7;
  undefined1 local_b0 [8];
  PropertyValueInfo info;
  UndeclaredBlockVariable *local_48;
  Var value;
  ScriptContext *local_38;
  
  pUVar5 = (UndeclaredBlockVariable *)(ulong)inlineCacheIndex;
  value = inlineCache;
  local_38 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar1 = pDisplay->length;
  index = 0;
  local_b0 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  info._56_8_ = pDisplay;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_b0,functionBody,(InlineCache *)value,inlineCacheIndex,true);
  uVar6 = (uint)uVar1;
  bVar7 = uVar6 != 0;
  if (bVar7) {
    do {
      aValue = FrameDisplay::GetItem((FrameDisplay *)info._56_8_,index);
      pRVar4 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,true,true,false,false,false>
                        (pRVar4,false,pRVar4,propertyId,&local_48,local_38,
                         (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_b0);
      if (bVar2) {
        bVar2 = false;
        pUVar5 = local_48;
      }
      else {
        bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,InlineCachePhase);
        if ((bVar2) && (DAT_015d346a == '\x01')) {
          CacheOperators::TraceCache
                    ((InlineCache *)value,L"PatchGetPropertyScoped",propertyId,local_38,pRVar4);
        }
        BVar3 = GetProperty_Internal<false>
                          (pRVar4,pRVar4,false,propertyId,&local_48,local_38,
                           (PropertyValueInfo *)local_b0);
        if (BVar3 == 0) {
          bVar2 = true;
        }
        else {
          bVar2 = false;
          pUVar5 = local_48;
          if ((propertyId != 0x2d5) &&
             ((((local_38->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
              == local_48)) goto LAB_00ae45f4;
        }
      }
      if (!bVar2) break;
      index = index + 1;
      bVar7 = index < uVar6;
    } while (index != uVar6);
  }
  scriptContext = local_38;
  if (!bVar7) {
    if (propertyId != 0x2d5) {
      if (propertyId == 0x2d6) {
        hCode = -0x7ff5ebe7;
      }
      else {
        object = VarTo<Js::DynamicObject>(defaultInstance);
        pUVar5 = (UndeclaredBlockVariable *)
                 PatchGetRootValue<false,Js::InlineCache>
                           (functionBody,(InlineCache *)value,inlineCacheIndex,object,propertyId);
        if ((((local_38->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr !=
            pUVar5) {
          return pUVar5;
        }
LAB_00ae45f4:
        hCode = -0x7ff5ec07;
      }
      JavascriptError::ThrowReferenceError(local_38,hCode,(PCWSTR)0x0);
    }
    pRVar4 = (((local_38->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             nullValue.ptr;
    moduleID = FunctionBody::GetModuleID(functionBody);
    pUVar5 = (UndeclaredBlockVariable *)
             OP_GetThis(pRVar4,moduleID,&scriptContext->super_ScriptContextInfo);
  }
  return pUVar5;
}

Assistant:

inline Var JavascriptOperators::PatchGetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var defaultInstance)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetPropertyScoped);
        // Get the property, using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();
        uint16 length = pDisplay->GetLength();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        for (uint16 i = 0; i < length; i++)
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            Var value;
            if (CacheOperators::TryGetProperty<true, true, true, false, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                    object, false, object, propertyId, &value, scriptContext, nullptr, &info))
            {
                return value;
            }

#if DBG_DUMP
            if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
            {
                CacheOperators::TraceCache(inlineCache, _u("PatchGetPropertyScoped"), propertyId, scriptContext, object);
            }
#endif
            if (JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, &info))
            {
                if (scriptContext->IsUndeclBlockVar(value) && propertyId != PropertyIds::_this)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
                return value;
            }
        }

        // There is no root decl for 'this', we should instead load the global 'this' value.
        if (propertyId == PropertyIds::_this)
        {
            Var varNull = OP_LdNull(scriptContext);
            return JavascriptOperators::OP_GetThis(varNull, functionBody->GetModuleID(), scriptContext);
        }
        else if (propertyId == PropertyIds::_super)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        // No one in the scope stack has the property, so get it from the default instance provided by the caller.
        Var value = JavascriptOperators::PatchGetRootValue<IsFromFullJit>(functionBody, inlineCache, inlineCacheIndex, VarTo<DynamicObject>(defaultInstance), propertyId);
        if (scriptContext->IsUndeclBlockVar(value))
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
        }
        return value;
        JIT_HELPER_END(Op_PatchGetPropertyScoped);
    }